

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O0

void wostringstream_suite::test_view(void)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> **this;
  __type v;
  size_type size;
  size_t __n;
  undefined1 auVar1 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_200;
  char *msg;
  void *local_1d0;
  undefined1 local_1c4;
  undefined1 local_1c3 [2];
  allocator<wchar_t> local_1c1;
  undefined1 local_1c0 [8];
  wstring input;
  undefined1 local_190 [8];
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  container;
  wostringstream output;
  
  this = &container.
          super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>
          .content;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)this);
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::ostream_buffer((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                    *)local_190,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)this);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_1c0,L"alpha",&local_1c1);
  std::allocator<wchar_t>::~allocator(&local_1c1);
  size = std::__cxx11::wstring::size();
  local_1c3[0] = ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                 ::grow((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                         *)local_190,size);
  local_1c4 = 1;
  __n = 0x78;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x78,"void wostringstream_suite::test_view()",local_1c3,&local_1c4);
  auVar1 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_1c0);
  local_1d0 = auVar1._8_8_;
  msg = auVar1._0_8_;
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::write((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
           *)local_190,(int)&msg,local_1d0,__n);
  std::__cxx11::wostringstream::str();
  v = std::operator==(&local_200,
                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      local_1c0);
  boost::detail::test_impl
            ("output.str() == input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x7a,"void wostringstream_suite::test_view()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_200);
  std::__cxx11::wstring::~wstring((wstring *)local_1c0);
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::~ostream_buffer((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                     *)local_190);
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)
             &container.
              super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>
              .content);
  return;
}

Assistant:

void test_view()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    std::wstring input = L"alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST(output.str() == input);
}